

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O1

void __thiscall OpenMD::ElementsTable::~ElementsTable(ElementsTable *this)

{
  Element *pEVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppEVar4;
  
  ppEVar4 = (this->elements_).
            super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar4 !=
      (this->elements_).super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pEVar1 = *ppEVar4;
      if (pEVar1 != (Element *)0x0) {
        pcVar2 = (pEVar1->name_)._M_dataplus._M_p;
        paVar3 = &(pEVar1->name_).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar3) {
          operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
        }
        pcVar2 = (pEVar1->symbol_)._M_dataplus._M_p;
        paVar3 = &(pEVar1->symbol_).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar3) {
          operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
        }
        operator_delete(pEVar1,0xa0);
      }
      ppEVar4 = ppEVar4 + 1;
    } while (ppEVar4 !=
             (this->elements_).
             super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppEVar4 = (this->elements_).
            super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar4 != (pointer)0x0) {
    operator_delete(ppEVar4,(long)(this->elements_).
                                  super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar4
                   );
  }
  pcVar2 = (this->envvar_)._M_dataplus._M_p;
  paVar3 = &(this->envvar_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->subdir_)._M_dataplus._M_p;
  paVar3 = &(this->subdir_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->dir_)._M_dataplus._M_p;
  paVar3 = &(this->dir_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->filename_)._M_dataplus._M_p;
  paVar3 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ElementsTable::~ElementsTable() {
    std::vector<Element*>::iterator i;
    for (i = elements_.begin(); i != elements_.end(); ++i)
      delete *i;
  }